

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocFromZeroPages
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  char *pcVar1;
  PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment_local;
  uint pageCount_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_local;
  
  if ((DAT_01eca380 & 1) != 0) {
    if (this->backgroundPageQueue != (BackgroundPageQueue *)0x0) {
      pcVar1 = TryAllocFromZeroPagesList(this,pageCount,pageSegment,this->backgroundPageQueue,false)
      ;
      return pcVar1;
    }
    if ((this->hasZeroQueuedPages & 1U) != 0) {
      pcVar1 = TryAllocFromZeroPagesList(this,pageCount,pageSegment,this->backgroundPageQueue,true);
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocFromZeroPages(uint pageCount, TPageSegment ** pageSegment)
{
#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        if (backgroundPageQueue != nullptr)
        {
            return TryAllocFromZeroPagesList(pageCount, pageSegment, backgroundPageQueue, false);
        }

        if (this->hasZeroQueuedPages)
        {
            __analysis_assume(backgroundPageQueue != nullptr);
            return TryAllocFromZeroPagesList(pageCount, pageSegment, backgroundPageQueue, true);
        }
    }
#endif

    return nullptr;
}